

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O0

void * Ver_FormulaParser(char *pFormula,void *pMan,Vec_Ptr_t *vNames,Vec_Ptr_t *vStackFn,
                        Vec_Int_t *vStackOp,char *pErrorMessage)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  Hop_Obj_t *pHVar5;
  int v;
  int Oper2;
  int Oper1;
  int Oper;
  int Flag;
  int nParans;
  Hop_Obj_t *bTemp;
  Hop_Obj_t *bFunc;
  char *pTemp;
  char *pErrorMessage_local;
  Vec_Int_t *vStackOp_local;
  Vec_Ptr_t *vStackFn_local;
  Vec_Ptr_t *vNames_local;
  void *pMan_local;
  char *pFormula_local;
  
  Vec_PtrClear(vNames);
  Vec_PtrClear(vStackFn);
  Vec_IntClear(vStackOp);
  iVar1 = strcmp(pFormula,"0");
  if ((iVar1 == 0) || (iVar1 = strcmp(pFormula,"1\'b0"), iVar1 == 0)) {
    pFormula_local = (char *)Hop_ManConst0((Hop_Man_t *)pMan);
  }
  else {
    iVar1 = strcmp(pFormula,"1");
    if ((iVar1 == 0) || (iVar1 = strcmp(pFormula,"1\'b1"), iVar1 == 0)) {
      pFormula_local = (char *)Hop_ManConst1((Hop_Man_t *)pMan);
    }
    else {
      Oper = 0;
      for (bFunc = (Hop_Obj_t *)pFormula; *(char *)&bFunc->field_0 != '\0';
          bFunc = (Hop_Obj_t *)((long)&bFunc->field_0 + 1)) {
        if (*(char *)&bFunc->field_0 == '(') {
          Oper = Oper + 1;
        }
        else if (*(char *)&bFunc->field_0 == ')') {
          Oper = Oper + -1;
        }
      }
      if (Oper == 0) {
        sVar3 = strlen(pFormula);
        pFormula[sVar3 + 2] = '\0';
        *(char *)&((Hop_Obj_t *)(pFormula + sVar3 + 1))->field_0 = ')';
        bFunc = (Hop_Obj_t *)(pFormula + sVar3 + 1);
        while (pHVar5 = (Hop_Obj_t *)((long)&bFunc[-1].Id + 3), pHVar5 != (Hop_Obj_t *)pFormula) {
          *(char *)&pHVar5->field_0 = *(char *)((long)&bFunc[-1].Id + 2);
          bFunc = pHVar5;
        }
        *(char *)&pHVar5->field_0 = '(';
        Oper1 = 1;
        for (bFunc = (Hop_Obj_t *)pFormula; *(char *)&bFunc->field_0 != '\0';
            bFunc = (Hop_Obj_t *)((long)&bFunc->field_0 + 1)) {
          switch(*(undefined1 *)&bFunc->field_0) {
          case 9:
          case 10:
          case 0xd:
          case 0x20:
            goto LAB_003e2a57;
          default:
            iVar1 = Ver_FormulaParserFindVar((char *)bFunc,vNames);
            if (*(char *)&bFunc->field_0 == '\\') {
              bFunc = (Hop_Obj_t *)((long)&bFunc->field_0 + 1);
            }
            pvVar4 = Vec_PtrEntry(vNames,iVar1 << 1);
            bFunc = (Hop_Obj_t *)((long)&bFunc->field_0 + (long)((int)pvVar4 + -1));
            if (Oper1 == 2) {
              sprintf(pErrorMessage,"Parse_FormulaParser(): Incorrect state.");
              return (void *)0x0;
            }
            pHVar5 = Hop_IthVar((Hop_Man_t *)pMan,iVar1);
            Vec_PtrPush(vStackFn,pHVar5);
            Oper1 = 2;
            break;
          case 0x21:
          case 0x7e:
            if (Oper1 == 2) {
              sprintf(pErrorMessage,"Parse_FormulaParser(): Variable before negation.");
              Oper1 = 4;
            }
            else {
              Vec_IntPush(vStackOp,7);
            }
            break;
          case 0x26:
          case 0x3a:
          case 0x3f:
          case 0x5e:
          case 0x7c:
            if (Oper1 == 2) {
              if (*(char *)&bFunc->field_0 == '&') {
                Vec_IntPush(vStackOp,6);
              }
              else if (*(char *)&bFunc->field_0 == '|') {
                Vec_IntPush(vStackOp,4);
              }
              else if (*(char *)&bFunc->field_0 == '^') {
                Vec_IntPush(vStackOp,5);
              }
              else if (*(char *)&bFunc->field_0 == '?') {
                Vec_IntPush(vStackOp,2);
              }
              Oper1 = 3;
            }
            else {
              sprintf(pErrorMessage,
                      "Parse_FormulaParser(): There is no variable before AND, EXOR, or OR.");
              Oper1 = 4;
            }
            break;
          case 0x28:
            if (Oper1 == 2) {
              sprintf(pErrorMessage,"Parse_FormulaParser(): Variable before a parenthesis.");
              Oper1 = 4;
            }
            else {
              Vec_IntPush(vStackOp,1);
              Oper1 = 1;
            }
            break;
          case 0x29:
            iVar1 = Vec_IntSize(vStackOp);
            if (iVar1 == 0) {
              sprintf(pErrorMessage,"Parse_FormulaParser(): There is no opening parenthesis\n");
              Oper1 = 4;
            }
            else {
              while (iVar1 = Vec_IntSize(vStackOp), iVar1 != 0) {
                iVar1 = Vec_IntPop(vStackOp);
                if (iVar1 == 1) goto LAB_003e2860;
                pHVar5 = Ver_FormulaParserTopOper((Hop_Man_t *)pMan,vStackFn,iVar1);
                if (pHVar5 == (Hop_Obj_t *)0x0) {
                  sprintf(pErrorMessage,"Parse_FormulaParser(): Unknown operation\n");
                  return (void *)0x0;
                }
              }
              sprintf(pErrorMessage,"Parse_FormulaParser(): There is no opening parenthesis\n");
              Oper1 = 4;
LAB_003e2860:
              if (Oper1 != 4) {
                Oper1 = 2;
              }
            }
          }
          if (Oper1 == 4) break;
          if (Oper1 != 1) {
            if (Oper1 == 2) {
              while (iVar1 = Vec_IntSize(vStackOp), iVar1 != 0) {
                iVar1 = Vec_IntPop(vStackOp);
                if (iVar1 != 7) {
                  Vec_IntPush(vStackOp,iVar1);
                  break;
                }
                pHVar5 = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
                pHVar5 = Hop_Not(pHVar5);
                Vec_PtrPush(vStackFn,pHVar5);
              }
            }
            else {
              while( true ) {
                iVar1 = Vec_IntPop(vStackOp);
                iVar2 = Vec_IntSize(vStackOp);
                if (iVar2 == 0) break;
                iVar2 = Vec_IntPop(vStackOp);
                if ((iVar2 < iVar1) || ((iVar1 == iVar2 && (iVar1 == 2)))) {
                  Vec_IntPush(vStackOp,iVar2);
                  Vec_IntPush(vStackOp,iVar1);
                  goto LAB_003e2a57;
                }
                pHVar5 = Ver_FormulaParserTopOper((Hop_Man_t *)pMan,vStackFn,iVar2);
                if (pHVar5 == (Hop_Obj_t *)0x0) {
                  sprintf(pErrorMessage,"Parse_FormulaParser(): Unknown operation\n");
                  return (void *)0x0;
                }
                Vec_IntPush(vStackOp,iVar1);
              }
              Vec_IntPush(vStackOp,iVar1);
            }
          }
LAB_003e2a57:
        }
        if (Oper1 != 4) {
          iVar1 = Vec_PtrSize(vStackFn);
          if (iVar1 == 0) {
            sprintf(pErrorMessage,"Parse_FormulaParser(): The input string is empty\n");
          }
          else {
            pvVar4 = Vec_PtrPop(vStackFn);
            iVar1 = Vec_PtrSize(vStackFn);
            if (iVar1 == 0) {
              iVar1 = Vec_IntSize(vStackOp);
              if (iVar1 == 0) {
                return pvVar4;
              }
              sprintf(pErrorMessage,
                      "Parse_FormulaParser(): Something is left in the operation stack\n");
            }
            else {
              sprintf(pErrorMessage,
                      "Parse_FormulaParser(): Something is left in the function stack\n");
            }
          }
        }
        pFormula_local = (char *)0x0;
      }
      else {
        sprintf(pErrorMessage,
                "Parse_FormulaParser(): Different number of opening and closing parentheses ().");
        pFormula_local = (char *)0x0;
      }
    }
  }
  return pFormula_local;
}

Assistant:

void * Ver_FormulaParser( char * pFormula, void * pMan, Vec_Ptr_t * vNames, Vec_Ptr_t * vStackFn, Vec_Int_t * vStackOp, char * pErrorMessage )
{
    char * pTemp;
    Hop_Obj_t * bFunc, * bTemp;
    int nParans, Flag;
    int Oper, Oper1, Oper2;
    int v;

    // clear the stacks and the names
    Vec_PtrClear( vNames );
    Vec_PtrClear( vStackFn );
    Vec_IntClear( vStackOp );

    if ( !strcmp(pFormula, "0") || !strcmp(pFormula, "1\'b0") )
        return Hop_ManConst0((Hop_Man_t *)pMan);
    if ( !strcmp(pFormula, "1") || !strcmp(pFormula, "1\'b1") )
        return Hop_ManConst1((Hop_Man_t *)pMan);

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        sprintf( pErrorMessage, "Parse_FormulaParser(): Different number of opening and closing parentheses ()." );
        return NULL;
    }
 
    // add parentheses
    pTemp = pFormula + strlen(pFormula) + 2;
    *pTemp-- = 0; *pTemp = ')';
    while ( --pTemp != pFormula )
        *pTemp = *(pTemp - 1);
    *pTemp = '(';

    // perform parsing
    Flag = VER_PARSE_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
    {
        switch ( *pTemp )
        {
        // skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
            continue;
/*
        // treat Constant 0 as a variable
        case VER_PARSE_SYM_CONST0:
            Vec_PtrPush( vStackFn, Hop_ManConst0(pMan) );  // Cudd_Ref( Hop_ManConst0(pMan) );
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): No operation symbol before constant 0." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Flag = VER_PARSE_FLAG_VAR; 
            break;

        // the same for Constant 1
        case VER_PARSE_SYM_CONST1:
            Vec_PtrPush( vStackFn, Hop_ManConst1(pMan) );  //  Cudd_Ref( Hop_ManConst1(pMan) );
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): No operation symbol before constant 1." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Flag = VER_PARSE_FLAG_VAR; 
            break;
*/
        case VER_PARSE_SYM_NEGBEF1:
        case VER_PARSE_SYM_NEGBEF2:
            if ( Flag == VER_PARSE_FLAG_VAR )
            {// if NEGBEF follows a variable, AND is assumed
                sprintf( pErrorMessage, "Parse_FormulaParser(): Variable before negation." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Vec_IntPush( vStackOp, VER_PARSE_OPER_NEG );
            break;

        case VER_PARSE_SYM_AND:
        case VER_PARSE_SYM_OR:
        case VER_PARSE_SYM_XOR:
        case VER_PARSE_SYM_MUX1:
        case VER_PARSE_SYM_MUX2:
            if ( Flag != VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): There is no variable before AND, EXOR, or OR." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            if ( *pTemp == VER_PARSE_SYM_AND )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_AND );
            else if ( *pTemp == VER_PARSE_SYM_OR )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_OR );
            else if ( *pTemp == VER_PARSE_SYM_XOR )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_XOR );
            else if ( *pTemp == VER_PARSE_SYM_MUX1 )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_MUX );
//            else if ( *pTemp == VER_PARSE_SYM_MUX2 )
//                Vec_IntPush( vStackOp, VER_PARSE_OPER_MUX );
            Flag = VER_PARSE_FLAG_OPER; 
            break;

        case VER_PARSE_SYM_OPEN:
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): Variable before a parenthesis." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Vec_IntPush( vStackOp, VER_PARSE_OPER_MARK );
            // after an opening bracket, it feels like starting over again
            Flag = VER_PARSE_FLAG_START; 
            break;

        case VER_PARSE_SYM_CLOSE:
            if ( Vec_IntSize( vStackOp ) )
            {
                while ( 1 )
                {
                    if ( !Vec_IntSize( vStackOp ) )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): There is no opening parenthesis\n" );
                        Flag = VER_PARSE_FLAG_ERROR; 
                        break;
                    }
                    Oper = Vec_IntPop( vStackOp );
                    if ( Oper == VER_PARSE_OPER_MARK )
                        break;
                    // skip the second MUX operation
//                    if ( Oper == VER_PARSE_OPER_MUX2 )
//                    {
//                        Oper = Vec_IntPop( vStackOp );
//                        assert( Oper == VER_PARSE_OPER_MUX1 );
//                    }

                    // perform the given operation
                    if ( Ver_FormulaParserTopOper( (Hop_Man_t *)pMan, vStackFn, Oper ) == NULL )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): Unknown operation\n" );
                        return NULL;
                    }
                }
            }
            else
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): There is no opening parenthesis\n" );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            if ( Flag != VER_PARSE_FLAG_ERROR )
                Flag = VER_PARSE_FLAG_VAR; 
            break;


        default:
            // scan the next name
            v = Ver_FormulaParserFindVar( pTemp, vNames );
            if ( *pTemp == '\\' )
                pTemp++;
            pTemp += (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*v ) - 1;

            // assume operation AND, if vars follow one another
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): Incorrect state." );
                return NULL;
            }
            bTemp = Hop_IthVar( (Hop_Man_t *)pMan, v );
            Vec_PtrPush( vStackFn, bTemp ); //  Cudd_Ref( bTemp );
            Flag = VER_PARSE_FLAG_VAR; 
            break;
        }

        if ( Flag == VER_PARSE_FLAG_ERROR )
            break;      // error exit
        else if ( Flag == VER_PARSE_FLAG_START )
            continue;  //  go on parsing
        else if ( Flag == VER_PARSE_FLAG_VAR )
            while ( 1 )
            {  // check if there are negations in the OpStack     
                if ( !Vec_IntSize(vStackOp) )
                    break;
                Oper = Vec_IntPop( vStackOp );
                if ( Oper != VER_PARSE_OPER_NEG )
                {
                    Vec_IntPush( vStackOp, Oper );
                    break;
                }
                else
                {
//                      Vec_PtrPush( vStackFn, Cudd_Not(Vec_PtrPop(vStackFn)) );
                      Vec_PtrPush( vStackFn, Hop_Not((Hop_Obj_t *)Vec_PtrPop(vStackFn)) );
                }
            }
        else // if ( Flag == VER_PARSE_FLAG_OPER )
            while ( 1 )
            {  // execute all the operations in the OpStack
               // with precedence higher or equal than the last one
                Oper1 = Vec_IntPop( vStackOp ); // the last operation
                if ( !Vec_IntSize(vStackOp) ) 
                {  // if it is the only operation, push it back
                    Vec_IntPush( vStackOp, Oper1 );
                    break;
                }
                Oper2 = Vec_IntPop( vStackOp ); // the operation before the last one
                if ( Oper2 >= Oper1 && !(Oper1 == Oper2 && Oper1 == VER_PARSE_OPER_MUX) )  
                {  // if Oper2 precedence is higher or equal, execute it
                    if ( Ver_FormulaParserTopOper( (Hop_Man_t *)pMan, vStackFn, Oper2 ) == NULL )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): Unknown operation\n" );
                        return NULL;
                    }
                    Vec_IntPush( vStackOp,  Oper1 );     // push the last operation back
                }
                else
                {  // if Oper2 precedence is lower, push them back and done
                    Vec_IntPush( vStackOp, Oper2 );
                    Vec_IntPush( vStackOp, Oper1 );
                    break;
                }
            }
    }

    if ( Flag != VER_PARSE_FLAG_ERROR )
    {
        if ( Vec_PtrSize(vStackFn) )
        {    
            bFunc = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
            if ( !Vec_PtrSize(vStackFn) )
                if ( !Vec_IntSize(vStackOp) )
                {
//                    Cudd_Deref( bFunc );
                    return bFunc;
                }
                else
                    sprintf( pErrorMessage, "Parse_FormulaParser(): Something is left in the operation stack\n" );
            else
                sprintf( pErrorMessage, "Parse_FormulaParser(): Something is left in the function stack\n" );
        }
        else
            sprintf( pErrorMessage, "Parse_FormulaParser(): The input string is empty\n" );
    }
//    Cudd_Ref( bFunc );
//    Cudd_RecursiveDeref( dd, bFunc );
    return NULL;
}